

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateFunctionCall3(ExpressionContext *ctx,SynBase *source,InplaceStr name,ExprBase *arg0,
                   ExprBase *arg1,ExprBase *arg2,bool allowFailure,bool allowInternal,
                   bool allowFastLookup)

{
  InplaceStr name_00;
  ExprBase *pEVar1;
  ArrayView<ArgumentData> arguments_00;
  undefined1 local_1b8 [12];
  char *local_1a8;
  char *pcStack_1a0;
  ArgumentData local_190;
  ArgumentData local_160;
  ArgumentData local_120;
  undefined1 local_f0 [8];
  SmallArray<ArgumentData,_3U> arguments;
  bool allowFastLookup_local;
  bool allowInternal_local;
  bool allowFailure_local;
  ExprBase *arg1_local;
  ExprBase *arg0_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  InplaceStr name_local;
  
  arguments.allocator._7_1_ = allowFailure;
  arguments.allocator._6_1_ = allowInternal;
  arguments.allocator._5_1_ = allowFastLookup;
  SmallArray<ArgumentData,_3U>::SmallArray((SmallArray<ArgumentData,_3U> *)local_f0,ctx->allocator);
  ArgumentData::ArgumentData(&local_120,arg0->source,false,(SynIdentifier *)0x0,arg0->type,arg0);
  SmallArray<ArgumentData,_3U>::push_back((SmallArray<ArgumentData,_3U> *)local_f0,&local_120);
  ArgumentData::ArgumentData(&local_160,arg1->source,false,(SynIdentifier *)0x0,arg1->type,arg1);
  SmallArray<ArgumentData,_3U>::push_back((SmallArray<ArgumentData,_3U> *)local_f0,&local_160);
  ArgumentData::ArgumentData(&local_190,arg2->source,false,(SynIdentifier *)0x0,arg2->type,arg2);
  SmallArray<ArgumentData,_3U>::push_back((SmallArray<ArgumentData,_3U> *)local_f0,&local_190);
  local_1a8 = name.begin;
  pcStack_1a0 = name.end;
  ArrayView<ArgumentData>::ArrayView<3u>
            ((ArrayView<ArgumentData> *)local_1b8,(SmallArray<ArgumentData,_3U> *)local_f0);
  name_00.end = pcStack_1a0;
  name_00.begin = local_1a8;
  arguments_00._12_4_ = 0;
  arguments_00.data = (ArgumentData *)local_1b8._0_8_;
  arguments_00.count = local_1b8._8_4_;
  pEVar1 = CreateFunctionCallByName
                     (ctx,source,name_00,arguments_00,(bool)(arguments.allocator._7_1_ & 1),
                      (bool)(arguments.allocator._6_1_ & 1),(bool)(arguments.allocator._5_1_ & 1));
  SmallArray<ArgumentData,_3U>::~SmallArray((SmallArray<ArgumentData,_3U> *)local_f0);
  return pEVar1;
}

Assistant:

ExprBase* CreateFunctionCall3(ExpressionContext &ctx, SynBase *source, InplaceStr name, ExprBase *arg0, ExprBase *arg1, ExprBase *arg2, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	SmallArray<ArgumentData, 3> arguments(ctx.allocator);

	arguments.push_back(ArgumentData(arg0->source, false, NULL, arg0->type, arg0));
	arguments.push_back(ArgumentData(arg1->source, false, NULL, arg1->type, arg1));
	arguments.push_back(ArgumentData(arg2->source, false, NULL, arg2->type, arg2));

	return CreateFunctionCallByName(ctx, source, name, arguments, allowFailure, allowInternal, allowFastLookup);
}